

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Di<(moira::Mode)5,_4> wrapper)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  An an;
  An an_00;
  
  switch(this->style->syntax) {
  case MOIRA:
  case MUSASHI:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '(';
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = ',';
    break;
  case MOIRA_MIT:
  case GNU_MIT:
    an.raw._2_2_ = 0;
    an.raw._0_2_ = (wrapper.ea)->reg;
    operator<<(this,an);
    cVar2 = '@';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = ")@("[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    goto LAB_00288b3e;
  case GNU:
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '(';
    break;
  default:
    goto switchD_00288aa4_default;
  }
  an_00.raw._2_2_ = 0;
  an_00.raw._0_2_ = (wrapper.ea)->reg;
  operator<<(this,an_00);
LAB_00288b3e:
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = ')';
switchD_00288aa4_default:
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Di<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:

            *this << "(" << Int{(i16)ea.ext1} << "," << An{ea.reg} << ")";
            return *this;

       case Syntax::GNU:

            *this << Int{(i16)ea.ext1} << "(" << An{ea.reg} << ")";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@(" << Int{(i16)ea.ext1} << ")";
            break;
    }

    return *this;
}